

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

uint32 * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetHasBits
          (GeneratedMessageReflection *this,Message *message)

{
  uint32 uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((this->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x776);
    other = LogMessage::operator<<(&local_50,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  uVar1 = ReflectionSchema::HasBitsOffset(&this->schema_);
  return (uint32 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1);
}

Assistant:

inline const uint32* GeneratedMessageReflection::GetHasBits(
    const Message& message) const {
  GOOGLE_DCHECK(schema_.HasHasbits());
  return &GetConstRefAtOffset<uint32>(message, schema_.HasBitsOffset());
}